

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdunzip.c
# Opt level: O3

char * pathdup(char *path)

{
  __int32_t *p_Var1;
  size_t __n;
  char *__dest;
  __int32_t **pp_Var2;
  int *piVar3;
  size_t sVar4;
  
  if ((path == (char *)0x0) || (*path == '\0')) {
    __dest = (char *)0x0;
  }
  else {
    for (__n = strlen(path); __n != 0; __n = __n - 1) {
      if (path[__n - 1] != '/') goto LAB_0010501e;
    }
    __n = 0;
LAB_0010501e:
    __dest = (char *)malloc(__n + 1);
    if (__dest == (char *)0x0) {
      piVar3 = __errno_location();
      *piVar3 = 0xc;
      error("malloc()");
    }
    if (L_opt == '\x01') {
      if (__n != 0) {
        pp_Var2 = __ctype_tolower_loc();
        p_Var1 = *pp_Var2;
        sVar4 = 0;
        do {
          __dest[sVar4] = (char)p_Var1[(byte)path[sVar4]];
          sVar4 = sVar4 + 1;
        } while (__n != sVar4);
      }
    }
    else {
      memcpy(__dest,path,__n);
    }
    __dest[__n] = '\0';
  }
  return __dest;
}

Assistant:

static char *
pathdup(const char *path)
{
	char *str;
	size_t i, len;

	if (path == NULL || path[0] == '\0')
		return (NULL);

	len = strlen(path);
	while (len && path[len - 1] == '/')
		len--;
	if ((str = malloc(len + 1)) == NULL) {
		errno = ENOMEM;
		error("malloc()");
	}
	if (L_opt) {
		for (i = 0; i < len; ++i)
			str[i] = (char)tolower((unsigned char)path[i]);
	} else {
		memcpy(str, path, len);
	}
	str[len] = '\0';

	return (str);
}